

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O1

string * __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineDeviceComputer *this,
          cmComputeLinkInformation *cli,string *stdLibString)

{
  _Base_ptr p_Var1;
  pointer pcVar2;
  cmGeneratorTarget *this_00;
  string *psVar3;
  cmLinkLineComputer *this_01;
  bool bVar4;
  TargetType TVar5;
  ItemVector *pIVar6;
  const_iterator cVar7;
  ostream *poVar8;
  pointer pIVar9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  string config;
  ostringstream fout;
  string local_250;
  undefined1 local_230 [32];
  _Base_ptr local_210;
  size_t local_208;
  string local_200;
  string *local_1e0;
  string *local_1d8;
  cmLinkLineComputer *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pIVar6 = cmComputeLinkInformation::GetItems(cli);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  pcVar2 = (cli->Config)._M_dataplus._M_p;
  local_1e0 = stdLibString;
  local_1d8 = __return_storage_ptr__;
  local_1d0 = &this->super_cmLinkLineComputer;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar2,pcVar2 + (cli->Config)._M_string_length);
  pIVar9 = (pIVar6->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pIVar9 != (pIVar6->
                super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = (_Base_ptr)(local_230 + 8);
    do {
      if ((pIVar9->Target != (cmGeneratorTarget *)0x0) &&
         (TVar5 = cmGeneratorTarget::GetType(pIVar9->Target), 1 < TVar5 - SHARED_LIBRARY)) {
        if (TVar5 == STATIC_LIBRARY) {
          this_00 = pIVar9->Target;
          local_230._0_8_ = local_230 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_230,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
          bVar4 = cmGeneratorTarget::GetPropertyAsBool(this_00,(string *)local_230);
          if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
            operator_delete((void *)local_230._0_8_,local_230._16_8_ + 1);
          }
          if (!bVar4) goto LAB_003d575d;
        }
        else if (TVar5 != INTERFACE_LIBRARY) {
LAB_003d575d:
          local_230._8_4_ = _S_red;
          local_230._16_8_ = 0;
          local_208 = 0;
          local_230._24_8_ = p_Var1;
          local_210 = p_Var1;
          cmGeneratorTarget::GetLanguages
                    (pIVar9->Target,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_230,&local_200);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CUDA","");
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_230,&local_250);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          this_01 = local_1d0;
          if (cVar7._M_node != p_Var1) {
            if (pIVar9->IsPath == true) {
              (*local_1d0->_vptr_cmLinkLineComputer[2])(&local_1c8,local_1d0,pIVar9);
              cmLinkLineComputer::ConvertToOutputFormat(&local_250,this_01,&local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_250._M_dataplus._M_p,local_250._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(pIVar9->Value)._M_dataplus._M_p,
                         (pIVar9->Value)._M_string_length);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_230);
        }
      }
      pIVar9 = pIVar9 + 1;
    } while (pIVar9 != (pIVar6->
                       super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  psVar3 = local_1d8;
  if (local_1e0->_M_string_length != 0) {
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(local_1e0->_M_dataplus)._M_p,
                        local_1e0->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  }
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar3;
}

Assistant:

std::string cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  // Write the library flags to the build rule.
  std::ostringstream fout;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  for (ItemVector::const_iterator li = items.begin(); li != items.end();
       ++li) {
    if (!li->Target) {
      continue;
    }

    bool skippable = false;
    switch (li->Target->GetType()) {
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::INTERFACE_LIBRARY:
        skippable = true;
        break;
      case cmStateEnums::STATIC_LIBRARY:
        // If a static library is resolving its device linking, it should
        // be removed for other device linking
        skippable =
          li->Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
        break;
      default:
        break;
    }

    if (skippable) {
      continue;
    }

    std::set<std::string> langs;
    li->Target->GetLanguages(langs, config);
    if (langs.count("CUDA") == 0) {
      continue;
    }

    if (li->IsPath) {
      fout << this->ConvertToOutputFormat(
        this->ConvertToLinkReference(li->Value));
    } else {
      fout << li->Value;
    }
    fout << " ";
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}